

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

void JS_FreeContext(JSContext *ctx)

{
  int *piVar1;
  JSValueUnion JVar2;
  int iVar3;
  JSRuntime *pJVar4;
  list_head *plVar5;
  int64_t iVar6;
  JSShape *sh;
  list_head *plVar7;
  long lVar8;
  long lVar9;
  JSValue JVar10;
  JSValue v;
  
  pJVar4 = ctx->rt;
  iVar3 = (ctx->header).ref_count;
  (ctx->header).ref_count = iVar3 + -1;
  if (iVar3 < 2) {
    plVar7 = (ctx->loaded_modules).next;
    while (plVar7 != &ctx->loaded_modules) {
      plVar5 = plVar7->next;
      js_free_module_def(ctx,(JSModuleDef *)&plVar7[-1].next);
      plVar7 = plVar5;
    }
    piVar1 = (int *)(ctx->global_obj).u.ptr;
    JVar10 = ctx->global_obj;
    if ((0xfffffff4 < (uint)(ctx->global_obj).tag) &&
       (iVar3 = *piVar1, *piVar1 = iVar3 + -1, iVar3 < 2)) {
      __JS_FreeValueRT(ctx->rt,JVar10);
    }
    piVar1 = (int *)(ctx->global_var_obj).u.ptr;
    JVar10 = ctx->global_var_obj;
    if ((0xfffffff4 < (uint)(ctx->global_var_obj).tag) &&
       (iVar3 = *piVar1, *piVar1 = iVar3 + -1, iVar3 < 2)) {
      __JS_FreeValueRT(ctx->rt,JVar10);
    }
    piVar1 = (int *)(ctx->throw_type_error).u.ptr;
    JVar10 = ctx->throw_type_error;
    if ((0xfffffff4 < (uint)(ctx->throw_type_error).tag) &&
       (iVar3 = *piVar1, *piVar1 = iVar3 + -1, iVar3 < 2)) {
      __JS_FreeValueRT(ctx->rt,JVar10);
    }
    piVar1 = (int *)(ctx->eval_obj).u.ptr;
    JVar10 = ctx->eval_obj;
    if ((0xfffffff4 < (uint)(ctx->eval_obj).tag) &&
       (iVar3 = *piVar1, *piVar1 = iVar3 + -1, iVar3 < 2)) {
      __JS_FreeValueRT(ctx->rt,JVar10);
    }
    piVar1 = (int *)(ctx->array_proto_values).u.ptr;
    JVar10 = ctx->array_proto_values;
    if ((0xfffffff4 < (uint)(ctx->array_proto_values).tag) &&
       (iVar3 = *piVar1, *piVar1 = iVar3 + -1, iVar3 < 2)) {
      __JS_FreeValueRT(ctx->rt,JVar10);
    }
    lVar8 = 0xa0;
    do {
      JVar2 = (JSValueUnion)((JSValueUnion *)((long)ctx + lVar8 + -8))->ptr;
      iVar6 = *(int64_t *)((long)&(ctx->header).ref_count + lVar8);
      if ((0xfffffff4 < (uint)iVar6) &&
         (iVar3 = *JVar2.ptr, *(int *)JVar2.ptr = iVar3 + -1, iVar3 < 2)) {
        JVar10.tag = iVar6;
        JVar10.u.ptr = JVar2.ptr;
        __JS_FreeValueRT(ctx->rt,JVar10);
      }
      lVar8 = lVar8 + 0x10;
    } while (lVar8 != 0x120);
    if (0 < pJVar4->class_count) {
      lVar9 = 8;
      lVar8 = 0;
      do {
        JVar2 = (JSValueUnion)((JSValueUnion *)((long)ctx->class_proto + lVar9 + -8))->ptr;
        iVar6 = *(int64_t *)((long)&ctx->class_proto->u + lVar9);
        if ((0xfffffff4 < (uint)iVar6) &&
           (iVar3 = *JVar2.ptr, *(int *)JVar2.ptr = iVar3 + -1, iVar3 < 2)) {
          v.tag = iVar6;
          v.u.ptr = JVar2.ptr;
          __JS_FreeValueRT(ctx->rt,v);
        }
        lVar8 = lVar8 + 1;
        lVar9 = lVar9 + 0x10;
      } while (lVar8 < pJVar4->class_count);
    }
    (*(pJVar4->mf).js_free)(&pJVar4->malloc_state,ctx->class_proto);
    piVar1 = (int *)(ctx->iterator_proto).u.ptr;
    JVar10 = ctx->iterator_proto;
    if ((0xfffffff4 < (uint)(ctx->iterator_proto).tag) &&
       (iVar3 = *piVar1, *piVar1 = iVar3 + -1, iVar3 < 2)) {
      __JS_FreeValueRT(ctx->rt,JVar10);
    }
    piVar1 = (int *)(ctx->async_iterator_proto).u.ptr;
    JVar10 = ctx->async_iterator_proto;
    if ((0xfffffff4 < (uint)(ctx->async_iterator_proto).tag) &&
       (iVar3 = *piVar1, *piVar1 = iVar3 + -1, iVar3 < 2)) {
      __JS_FreeValueRT(ctx->rt,JVar10);
    }
    piVar1 = (int *)(ctx->promise_ctor).u.ptr;
    JVar10 = ctx->promise_ctor;
    if ((0xfffffff4 < (uint)(ctx->promise_ctor).tag) &&
       (iVar3 = *piVar1, *piVar1 = iVar3 + -1, iVar3 < 2)) {
      __JS_FreeValueRT(ctx->rt,JVar10);
    }
    piVar1 = (int *)(ctx->array_ctor).u.ptr;
    JVar10 = ctx->array_ctor;
    if ((0xfffffff4 < (uint)(ctx->array_ctor).tag) &&
       (iVar3 = *piVar1, *piVar1 = iVar3 + -1, iVar3 < 2)) {
      __JS_FreeValueRT(ctx->rt,JVar10);
    }
    piVar1 = (int *)(ctx->regexp_ctor).u.ptr;
    JVar10 = ctx->regexp_ctor;
    if ((0xfffffff4 < (uint)(ctx->regexp_ctor).tag) &&
       (iVar3 = *piVar1, *piVar1 = iVar3 + -1, iVar3 < 2)) {
      __JS_FreeValueRT(ctx->rt,JVar10);
    }
    piVar1 = (int *)(ctx->function_ctor).u.ptr;
    JVar10 = ctx->function_ctor;
    if ((0xfffffff4 < (uint)(ctx->function_ctor).tag) &&
       (iVar3 = *piVar1, *piVar1 = iVar3 + -1, iVar3 < 2)) {
      __JS_FreeValueRT(ctx->rt,JVar10);
    }
    piVar1 = (int *)(ctx->function_proto).u.ptr;
    JVar10 = ctx->function_proto;
    if ((0xfffffff4 < (uint)(ctx->function_proto).tag) &&
       (iVar3 = *piVar1, *piVar1 = iVar3 + -1, iVar3 < 2)) {
      __JS_FreeValueRT(ctx->rt,JVar10);
    }
    sh = ctx->array_shape;
    if (sh != (JSShape *)0x0) {
      pJVar4 = ctx->rt;
      iVar3 = (sh->header).ref_count;
      (sh->header).ref_count = iVar3 + -1;
      if (iVar3 < 2) {
        js_free_shape0(pJVar4,sh);
      }
    }
    plVar7 = (ctx->link).prev;
    plVar5 = (ctx->link).next;
    plVar7->next = plVar5;
    plVar5->prev = plVar7;
    (ctx->link).prev = (list_head *)0x0;
    (ctx->link).next = (list_head *)0x0;
    plVar7 = (ctx->header).link.prev;
    plVar5 = (ctx->header).link.next;
    plVar7->next = plVar5;
    plVar5->prev = plVar7;
    (ctx->header).link.prev = (list_head *)0x0;
    (ctx->header).link.next = (list_head *)0x0;
    (*(ctx->rt->mf).js_free)(&ctx->rt->malloc_state,ctx);
    return;
  }
  return;
}

Assistant:

void JS_FreeContext(JSContext *ctx)
{
    JSRuntime *rt = ctx->rt;
    int i;

    if (--ctx->header.ref_count > 0)
        return;
    assert(ctx->header.ref_count == 0);
    
#ifdef DUMP_ATOMS
    JS_DumpAtoms(ctx->rt);
#endif
#ifdef DUMP_SHAPES
    JS_DumpShapes(ctx->rt);
#endif
#ifdef DUMP_OBJECTS
    {
        struct list_head *el;
        JSGCObjectHeader *p;
        printf("JSObjects: {\n");
        JS_DumpObjectHeader(ctx->rt);
        list_for_each(el, &rt->gc_obj_list) {
            p = list_entry(el, JSGCObjectHeader, link);
            JS_DumpGCObject(rt, p);
        }
        printf("}\n");
    }
#endif
#ifdef DUMP_MEM
    {
        JSMemoryUsage stats;
        JS_ComputeMemoryUsage(rt, &stats);
        JS_DumpMemoryUsage(stdout, &stats, rt);
    }
#endif

    js_free_modules(ctx, JS_FREE_MODULE_ALL);

    JS_FreeValue(ctx, ctx->global_obj);
    JS_FreeValue(ctx, ctx->global_var_obj);

    JS_FreeValue(ctx, ctx->throw_type_error);
    JS_FreeValue(ctx, ctx->eval_obj);

    JS_FreeValue(ctx, ctx->array_proto_values);
    for(i = 0; i < JS_NATIVE_ERROR_COUNT; i++) {
        JS_FreeValue(ctx, ctx->native_error_proto[i]);
    }
    for(i = 0; i < rt->class_count; i++) {
        JS_FreeValue(ctx, ctx->class_proto[i]);
    }
    js_free_rt(rt, ctx->class_proto);
    JS_FreeValue(ctx, ctx->iterator_proto);
    JS_FreeValue(ctx, ctx->async_iterator_proto);
    JS_FreeValue(ctx, ctx->promise_ctor);
    JS_FreeValue(ctx, ctx->array_ctor);
    JS_FreeValue(ctx, ctx->regexp_ctor);
    JS_FreeValue(ctx, ctx->function_ctor);
    JS_FreeValue(ctx, ctx->function_proto);

    js_free_shape_null(ctx->rt, ctx->array_shape);

    list_del(&ctx->link);
    remove_gc_object(&ctx->header);
    js_free_rt(ctx->rt, ctx);
}